

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_AllocAndInit
               (CLzmaEnc *p,UInt32 keepWindowSize,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  ISzAlloc *in_RCX;
  CLzmaEnc *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int __result__;
  UInt32 i;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffe8;
  SRes local_4;
  
  for (uVar1 = 0;
      (uVar1 < 0x1f && ((uint)(1 << ((byte)uVar1 & 0x1f)) < *(uint *)(in_RDI + 0x3d350)));
      uVar1 = uVar1 + 1) {
  }
  *(uint *)(in_RDI + 0x33bc8) = uVar1 << 1;
  *(undefined4 *)(in_RDI + 0x3d344) = 0;
  *(undefined4 *)(in_RDI + 0x3d34c) = 0;
  local_4 = LzmaEnc_Alloc((CLzmaEnc *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                          (UInt32)((ulong)in_RDX >> 0x20),in_RCX,
                          (ISzAlloc *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    LzmaEnc_Init(in_RDX);
    LzmaEnc_InitPrices((CLzmaEnc *)0x23b7a3);
    *(undefined8 *)(in_RDI + 0x3d338) = 0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static SRes LzmaEnc_AllocAndInit(CLzmaEnc* p, UInt32 keepWindowSize, ISzAlloc* alloc, ISzAlloc* allocBig) {
  UInt32 i;
  for (i = 0; i < (UInt32)kDicLogSizeMaxCompress; i++)
    if (p->dictSize <= ((UInt32)1 << i))
      break;
  p->distTableSize = i * 2;

  p->finished = False;
  p->result = SZ_OK;
  RINOK(LzmaEnc_Alloc(p, keepWindowSize, alloc, allocBig));
  LzmaEnc_Init(p);
  LzmaEnc_InitPrices(p);
  p->nowPos64 = 0;
  return SZ_OK;
}